

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnumeric.cpp
# Opt level: O1

int qFpClassify(double val)

{
  int iVar1;
  
  iVar1 = 2;
  if ((val != 0.0) || (NAN(val))) {
    if (NAN(val)) {
      return 0;
    }
    iVar1 = 1;
    if (ABS(val) != INFINITY) {
      return (2.2250738585072014e-308 <= ABS(val)) + 3;
    }
  }
  return iVar1;
}

Assistant:

Q_CORE_EXPORT int qFpClassify(double val) { return qt_fpclassify(val); }